

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv__process_init(uv_loop_t *loop)

{
  uv_loop_t *puVar1;
  int err;
  uv_loop_t *loop_local;
  
  loop_local._4_4_ = uv_signal_init(loop,&loop->child_watcher);
  if (loop_local._4_4_ == 0) {
    if (((((loop->child_watcher).flags & 8) != 0) &&
        ((loop->child_watcher).flags = (loop->child_watcher).flags & 0xfffffff7,
        ((loop->child_watcher).flags & 1) == 0)) && (((loop->child_watcher).flags & 4) != 0)) {
      puVar1 = (loop->child_watcher).loop;
      puVar1->active_handles = puVar1->active_handles - 1;
    }
    (loop->child_watcher).flags = (loop->child_watcher).flags | 0x10;
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv__process_init(uv_loop_t* loop) {
  int err;

  err = uv_signal_init(loop, &loop->child_watcher);
  if (err)
    return err;
  uv__handle_unref(&loop->child_watcher);
  loop->child_watcher.flags |= UV_HANDLE_INTERNAL;
  return 0;
}